

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O3

void __thiscall MeshSplitter::Execute(MeshSplitter *this,aiScene *pScene)

{
  uint uVar1;
  aiMesh **__s;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  source_mesh_map;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pScene->mNumMeshes == 0) {
    uVar1 = 0;
  }
  else {
    uVar5 = 0;
    do {
      SplitMesh(this,(uint)uVar5,pScene->mMeshes[uVar5],&local_48);
      uVar5 = uVar5 + 1;
      uVar1 = pScene->mNumMeshes;
    } while (uVar5 < uVar1);
  }
  uVar5 = (long)local_48.
                super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar5 >> 4;
  uVar3 = (uint)uVar4;
  if (uVar1 != uVar3) {
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    pScene->mNumMeshes = uVar3;
    uVar5 = uVar5 >> 1 & 0x7fffffff8;
    __s = (aiMesh **)operator_new__(uVar5);
    memset(__s,0,uVar5);
    pScene->mMeshes = __s;
    if (uVar3 != 0) {
      lVar2 = 0;
      do {
        *(undefined8 *)((long)pScene->mMeshes + lVar2) =
             *(undefined8 *)
              ((long)&(local_48.
                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar2 * 2);
        lVar2 = lVar2 + 8;
      } while ((uVar4 & 0xffffffff) << 3 != lVar2);
    }
    UpdateNode(this,pScene->mRootNode,&local_48);
  }
  if (local_48.
      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MeshSplitter::Execute( aiScene* pScene) {
	std::vector<std::pair<aiMesh*, unsigned int> > source_mesh_map;

	for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
		SplitMesh(a, pScene->mMeshes[a],source_mesh_map);
	}

	const unsigned int size = static_cast<unsigned int>(source_mesh_map.size());
	if (size != pScene->mNumMeshes) {
		// it seems something has been split. rebuild the mesh list
		delete[] pScene->mMeshes;
		pScene->mNumMeshes = size;
		pScene->mMeshes = new aiMesh*[size]();

		for (unsigned int i = 0; i < size;++i) {
			pScene->mMeshes[i] = source_mesh_map[i].first;
		}

		// now we need to update all nodes
		UpdateNode(pScene->mRootNode,source_mesh_map);
	}
}